

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandSimSec(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  int fMiter;
  int c;
  int nArgcNew;
  char **pArgvNew;
  int fDelete2;
  int fDelete1;
  Abc_Ntk_t *pNtk2;
  Abc_Ntk_t *pNtk1;
  Abc_Ntk_t *pNtk;
  Ssw_Pars_t *pPars;
  Ssw_Pars_t Pars;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk = (Abc_Ntk_t *)&pPars;
  Pars.pFunc = argv;
  pNtk1 = Abc_FrameReadNtk(pAbc);
  bVar1 = true;
  Ssw_ManSetDefaultParams((Ssw_Pars_t *)pNtk);
  *(undefined4 *)&pNtk->vLtlProperties = 1;
  pNtk->nObjCounts[2] = 1;
  Extra_UtilGetoptReset();
LAB_0024d2cd:
  do {
    iVar2 = Extra_UtilGetopt(argc,(char **)Pars.pFunc,"FDcymvh");
    if (iVar2 == -1) {
      if (bVar1) {
        iVar2 = Abc_NtkIsStrash(pNtk1);
        if (iVar2 == 0) {
          Abc_Print(-1,"This command works only for structrally hashed networks. Run \"st\".\n");
          return 0;
        }
        Abc_NtkDarSimSec(pNtk1,(Abc_Ntk_t *)0x0,(Ssw_Pars_t *)pNtk);
      }
      else {
        iVar2 = Abc_NtkPrepareTwoNtks
                          (_stdout,pNtk1,(char **)((long)Pars.pFunc + (long)globalUtilOptind * 8),
                           argc - globalUtilOptind,&pNtk2,(Abc_Ntk_t **)&fDelete2,
                           (int *)((long)&pArgvNew + 4),(int *)&pArgvNew);
        if (iVar2 == 0) {
          return 1;
        }
        iVar2 = Abc_NtkLatchNum(pNtk2);
        if ((iVar2 == 0) || (iVar2 = Abc_NtkLatchNum(_fDelete2), iVar2 == 0)) {
          if (pArgvNew._4_4_ != 0) {
            Abc_NtkDelete(pNtk2);
          }
          if ((int)pArgvNew != 0) {
            Abc_NtkDelete(_fDelete2);
          }
          Abc_Print(-1,"The network has no latches. Used combinational command \"cec\".\n");
          return 0;
        }
        Abc_NtkDarSimSec(pNtk2,_fDelete2,(Ssw_Pars_t *)pNtk);
        if (pArgvNew._4_4_ != 0) {
          Abc_NtkDelete(pNtk2);
        }
        if ((int)pArgvNew != 0) {
          Abc_NtkDelete(_fDelete2);
        }
      }
      return 0;
    }
    switch(iVar2) {
    case 0x44:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-D\" should be followed by an integer.\n");
        goto LAB_0024d5f2;
      }
      iVar2 = atoi(*(char **)((long)Pars.pFunc + (long)globalUtilOptind * 8));
      *(int *)((long)&pNtk->vLtlProperties + 4) = iVar2;
      iVar2 = *(int *)((long)&pNtk->vLtlProperties + 4);
      break;
    default:
      goto LAB_0024d5f2;
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_0024d5f2;
      }
      iVar2 = atoi(*(char **)((long)Pars.pFunc + (long)globalUtilOptind * 8));
      *(int *)&pNtk->pName = iVar2;
      iVar2 = *(int *)&pNtk->pName;
      break;
    case 99:
      *(uint *)&pNtk->vLtlProperties = *(uint *)&pNtk->vLtlProperties ^ 1;
      goto LAB_0024d2cd;
    case 0x6d:
      bVar1 = (bool)(bVar1 ^ 1);
      goto LAB_0024d2cd;
    case 0x76:
      pNtk->nObjCounts[2] = pNtk->nObjCounts[2] ^ 1;
      goto LAB_0024d2cd;
    case 0x79:
      *(uint *)((long)&pNtk->vPis + 4) = *(uint *)((long)&pNtk->vPis + 4) ^ 1;
      goto LAB_0024d2cd;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar2 < 0) {
LAB_0024d5f2:
      Abc_Print(-2,"usage: simsec [-FD num] [-mcyv] <file1> <file2>\n");
      Abc_Print(-2,"\t         performs SEC using structural similarity\n");
      Abc_Print(-2,"\t-F num : the limit on the depth of induction [default = %d]\n",
                (ulong)*(uint *)&pNtk->pName);
      Abc_Print(-2,"\t-D num : the distance for extending islands [default = %d]\n",
                (ulong)*(uint *)((long)&pNtk->vLtlProperties + 4));
      pcVar3 = "two networks";
      if (bVar1) {
        pcVar3 = "miter";
      }
      Abc_Print(-2,"\t-m     : toggles miter vs. two networks [default = %s]\n",pcVar3);
      pcVar3 = "full";
      if (*(int *)&pNtk->vLtlProperties != 0) {
        pcVar3 = "partial";
      }
      Abc_Print(-2,"\t-c     : uses partial vs. full signal correspondence [default = %s]\n",pcVar3)
      ;
      pcVar3 = "no";
      if (*(int *)((long)&pNtk->vPis + 4) != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-y     : dumps speculatively reduced miter of the classes [default = %s]\n",
                pcVar3);
      pcVar3 = "no";
      if (pNtk->nObjCounts[2] != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggles verbose output [default = %s]\n",pcVar3);
      Abc_Print(-2,"\tfile1  : (optional) the file with the first network\n");
      Abc_Print(-2,"\tfile2  : (optional) the file with the second network\n");
      Abc_Print(-2,"\t         if no files are given, uses the current network and its spec\n");
      Abc_Print(-2,"\t         if one file is given, uses the current network and the file\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandSimSec( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Ssw_Pars_t Pars, * pPars = &Pars;
    Abc_Ntk_t * pNtk, * pNtk1, * pNtk2;
    int fDelete1, fDelete2;
    char ** pArgvNew;
    int nArgcNew, c;
    int fMiter;

    extern int Abc_NtkDarSimSec( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, Ssw_Pars_t * pPars );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fMiter = 1;
    Ssw_ManSetDefaultParams( pPars );
    pPars->fPartSigCorr = 1;
    pPars->fVerbose     = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FDcymvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesK = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesK < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nIsleDist = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIsleDist < 0 )
                goto usage;
            break;
        case 'm':
            fMiter ^= 1;
            break;
        case 'c':
            pPars->fPartSigCorr ^= 1;
            break;
        case 'y':
            pPars->fDumpSRInit ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }

    if ( fMiter )
    {
//        Abc_Ntk_t * pNtkA, * pNtkB;
        if ( !Abc_NtkIsStrash(pNtk) )
        {
            Abc_Print( -1, "This command works only for structrally hashed networks. Run \"st\".\n" );
            return 0;
        }
        Abc_NtkDarSimSec( pNtk, NULL, pPars );
/*
        pNtkA = Abc_NtkDup( pNtk );
        pNtkB = Abc_NtkDup( pNtk );
        Abc_NtkDarSimSec( pNtkA, pNtkB, pPars );
        Abc_NtkDelete( pNtkA );
        Abc_NtkDelete( pNtkB );
*/
    }
    else
    {
        pArgvNew = argv + globalUtilOptind;
        nArgcNew = argc - globalUtilOptind;
        if ( !Abc_NtkPrepareTwoNtks( stdout, pNtk, pArgvNew, nArgcNew, &pNtk1, &pNtk2, &fDelete1, &fDelete2 ) )
            return 1;
        if ( Abc_NtkLatchNum(pNtk1) == 0 || Abc_NtkLatchNum(pNtk2) == 0 )
        {
            if ( fDelete1 ) Abc_NtkDelete( pNtk1 );
            if ( fDelete2 ) Abc_NtkDelete( pNtk2 );
            Abc_Print( -1, "The network has no latches. Used combinational command \"cec\".\n" );
            return 0;
        }
        // perform verification
        Abc_NtkDarSimSec( pNtk1, pNtk2, pPars );
        if ( fDelete1 ) Abc_NtkDelete( pNtk1 );
        if ( fDelete2 ) Abc_NtkDelete( pNtk2 );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: simsec [-FD num] [-mcyv] <file1> <file2>\n" );
    Abc_Print( -2, "\t         performs SEC using structural similarity\n" );
    Abc_Print( -2, "\t-F num : the limit on the depth of induction [default = %d]\n", pPars->nFramesK );
    Abc_Print( -2, "\t-D num : the distance for extending islands [default = %d]\n", pPars->nIsleDist );
    Abc_Print( -2, "\t-m     : toggles miter vs. two networks [default = %s]\n", fMiter? "miter": "two networks" );
    Abc_Print( -2, "\t-c     : uses partial vs. full signal correspondence [default = %s]\n", pPars->fPartSigCorr? "partial": "full" );
    Abc_Print( -2, "\t-y     : dumps speculatively reduced miter of the classes [default = %s]\n", pPars->fDumpSRInit? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles verbose output [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\tfile1  : (optional) the file with the first network\n");
    Abc_Print( -2, "\tfile2  : (optional) the file with the second network\n");
    Abc_Print( -2, "\t         if no files are given, uses the current network and its spec\n");
    Abc_Print( -2, "\t         if one file is given, uses the current network and the file\n");
    return 1;
}